

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_lookup_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_LookupTest_::
EqualRange<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(EqualRange<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  internal iVar1;
  Inner *pIVar2;
  ctrl_t *pcVar3;
  long lVar4;
  __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  key;
  __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  _Var5;
  pointer *__ptr;
  char *pcVar6;
  difference_type __n;
  AssertHelperData *pAVar7;
  difference_type __n_1;
  AssertionResult gtest_ar;
  vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> values;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator>
  r;
  TypeParam m;
  AssertHelper local_588;
  internal local_580 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_578;
  AssertHelper local_570;
  iterator local_568;
  __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  local_538;
  __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  _Stack_530;
  long local_528;
  pair<const_int,_int> *local_518;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator>
  local_510;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_4b0;
  
  local_538._M_current = (pair<const_int,_int> *)0x0;
  _Stack_530._M_current = (pair<const_int,_int> *)0x0;
  local_528 = 0;
  std::
  generate_n<std::back_insert_iterator<std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>>,int,phmap::priv::hash_internal::Generator<std::pair<int_const,int>,void>>
            ();
  _Var5._M_current = _Stack_530._M_current;
  lVar4 = 0x40;
  do {
    *(undefined8 *)((long)local_4b0.sets_._M_elems + lVar4 + -0x30) = 0;
    *(undefined8 *)((long)local_4b0.sets_._M_elems + lVar4 + -0x28) = 0;
    *(undefined8 *)((long)local_4b0.sets_._M_elems + lVar4 + -0x40) = 0;
    *(undefined8 *)((long)local_4b0.sets_._M_elems + lVar4 + -0x38) = 0;
    *(undefined8 *)((long)local_4b0.sets_._M_elems + lVar4 + -0x18) = 0;
    *(long *)((long)local_4b0.sets_._M_elems + lVar4 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_4b0.sets_._M_elems + lVar4 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_4b0.sets_._M_elems[0].set_.ctrl_ + lVar4) = 0;
    lVar4 = lVar4 + 0x48;
  } while (lVar4 != 0x4c0);
  if (local_538._M_current != _Stack_530._M_current) {
    key._M_current = local_538._M_current;
    do {
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
      ::equal_range<int>(&local_510,&local_4b0,&(key._M_current)->first);
      pcVar3 = local_510.second.it_.ctrl_;
      pIVar2 = local_510.second.inner_;
      local_570.data_._0_4_ = 0;
      local_568.it_end_.ctrl_ = local_510.first.it_end_.ctrl_;
      local_568.it_end_.field_1 = local_510.first.it_end_.field_1;
      local_568.it_.ctrl_ = local_510.first.it_.ctrl_;
      local_568.it_.field_1 = local_510.first.it_.field_1;
      local_568.inner_ = local_510.first.inner_;
      local_568.inner_end_ = local_510.first.inner_end_;
      pAVar7 = (AssertHelperData *)0x0;
      while ((local_568.inner_ != pIVar2 ||
             ((local_568.inner_ != (Inner *)0x0 && (local_568.it_.ctrl_ != pcVar3))))) {
        parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
        ::iterator::operator++(&local_568);
        pAVar7 = (AssertHelperData *)((long)&pAVar7->type + 1);
      }
      local_588.data_ = pAVar7;
      testing::internal::CmpHelperEQ<int,long>
                (local_580,"0","std::distance(r.first, r.second)",(int *)&local_570,
                 (long *)&local_588);
      if (local_580[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_568);
        if (local_578 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = (local_578->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_588,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x6b,pcVar6);
        testing::internal::AssertHelper::operator=(&local_588,(Message *)&local_568);
        goto LAB_001ff8a4;
      }
      if (local_578 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_578,local_578);
      }
      key._M_current = key._M_current + 1;
    } while (key._M_current != _Var5._M_current);
  }
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::pair<int_const,int>*,std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>>>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_4b0,local_538,_Stack_530);
  local_518 = _Stack_530._M_current;
  if (local_538._M_current != _Stack_530._M_current) {
    _Var5._M_current = local_538._M_current;
    do {
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
      ::equal_range<int>(&local_510,&local_4b0,&(_Var5._M_current)->first);
      pcVar3 = local_510.second.it_.ctrl_;
      pIVar2 = local_510.second.inner_;
      local_570.data_._0_4_ = 1;
      local_568.it_end_.ctrl_ = local_510.first.it_end_.ctrl_;
      local_568.it_end_.field_1 = local_510.first.it_end_.field_1;
      local_568.it_.ctrl_ = local_510.first.it_.ctrl_;
      local_568.it_.field_1.slot_ = (slot_type *)local_510.first.it_.field_1;
      local_568.inner_ = local_510.first.inner_;
      local_568.inner_end_ = local_510.first.inner_end_;
      pAVar7 = (AssertHelperData *)0x0;
      while ((local_568.inner_ != pIVar2 ||
             ((local_568.inner_ != (Inner *)0x0 && (local_568.it_.ctrl_ != pcVar3))))) {
        parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
        ::iterator::operator++(&local_568);
        pAVar7 = (AssertHelperData *)((long)&pAVar7->type + 1);
      }
      local_588.data_ = pAVar7;
      testing::internal::CmpHelperEQ<int,long>
                (local_580,"1","std::distance(r.first, r.second)",(int *)&local_570,
                 (long *)&local_588);
      iVar1 = local_580[0];
      if (local_580[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_568);
        if (local_578 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = (local_578->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_588,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x70,pcVar6);
        testing::internal::AssertHelper::operator=(&local_588,(Message *)&local_568);
LAB_001ff8a4:
        testing::internal::AssertHelper::~AssertHelper(&local_588);
        if (local_568.inner_ != (Inner *)0x0) {
          (**(code **)(((local_568.inner_)->set_).ctrl_ + 8))();
        }
        if (local_578 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_578,local_578);
        }
        break;
      }
      if (local_578 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_578,local_578);
      }
      testing::internal::CmpHelperEQ<int,int>
                (local_580,"p.second","get<1>(*r.first)",&(_Var5._M_current)->second,
                 (int *)((long)local_510.first.it_.field_1.slot_ + 4));
      if (local_580[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_588);
        testing::PrintToString<int>((string *)&local_568,&(_Var5._M_current)->first);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_588.data_)->line,(char *)local_568.inner_,
                   (long)local_568.inner_end_);
        pcVar6 = "";
        if (local_578 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = (local_578->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_570,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x71,pcVar6);
        testing::internal::AssertHelper::operator=(&local_570,(Message *)&local_588);
        testing::internal::AssertHelper::~AssertHelper(&local_570);
        if ((EmbeddedIterator *)local_568.inner_ != &local_568.it_) {
          operator_delete(local_568.inner_,(ulong)(local_568.it_.ctrl_ + 1));
        }
        if (local_588.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_588.data_ + 8))();
        }
      }
      if (local_578 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_578,local_578);
      }
    } while ((iVar1 != (internal)0x0) &&
            (_Var5._M_current = _Var5._M_current + 1, _Var5._M_current != local_518));
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set(&local_4b0);
  if (local_538._M_current != (pair<const_int,_int> *)0x0) {
    operator_delete(local_538._M_current,local_528 - (long)local_538._M_current);
  }
  return;
}

Assistant:

TYPED_TEST_P(LookupTest, EqualRange) {
  using std::get;
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m;
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(0, std::distance(r.first, r.second));
  }
  m.insert(values.begin(), values.end());
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(1, std::distance(r.first, r.second));
    EXPECT_EQ(p.second, get<1>(*r.first)) << ::testing::PrintToString(p.first);
  }
}